

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall QOpenGLShaderPrivate::~QOpenGLShaderPrivate(QOpenGLShaderPrivate *this)

{
  void *pvVar1;
  QObjectPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QOpenGLShaderPrivate_00213e80;
  pvVar1 = *(void **)(in_RDI + 0xa0);
  if (pvVar1 != (void *)0x0) {
    QOpenGLExtraFunctions::~QOpenGLExtraFunctions((QOpenGLExtraFunctions *)0x171490);
    operator_delete(pvVar1,8);
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    QOpenGLSharedResource::free();
  }
  QString::~QString((QString *)0x1714c7);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

QOpenGLShaderPrivate::~QOpenGLShaderPrivate()
{
    delete glfuncs;
    if (shaderGuard)
        shaderGuard->free();
}